

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O1

Point2f __thiscall pbrt::PMJ02BNSampler::Get2D(PMJ02BNSampler *this)

{
  Tuple2<pbrt::Point2,_float> TVar1;
  uint uVar2;
  int iVar3;
  Tuple2<pbrt::Point2,_int> TVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  uVar8 = this->sampleIndex;
  uVar2 = this->dimension;
  if (4 < (long)(int)uVar2) {
    uVar7 = (long)*(int *)(Options + 4) ^
            ((long)(int)uVar2 << 0x10 |
            (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.x << 0x30) ^
            (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.y << 0x20;
    uVar7 = (uVar7 >> 0x1f ^ uVar7) * 0x7fb5d329728ea185;
    lVar10 = (uVar7 >> 0x1b ^ uVar7) * -0x7e25210b43d22bb3;
    uVar6 = (uint)((ulong)lVar10 >> 0x21) ^ (uint)lVar10;
    uVar9 = this->samplesPerPixel;
    uVar11 = uVar9 - 1 >> 1 | uVar9 - 1;
    uVar11 = uVar11 >> 2 | uVar11;
    uVar11 = uVar11 >> 4 | uVar11;
    uVar11 = uVar11 >> 8 | uVar11;
    uVar11 = uVar11 >> 0x10 | uVar11;
    do {
      uVar8 = (uVar8 ^ uVar6) * -0x1e8f76c3 ^ uVar6 >> 0x10;
      uVar8 = ((uVar8 & uVar11) >> 4 ^ uVar6 >> 8 ^ uVar8) * 0x929eb3f ^ uVar6 >> 0x17;
      uVar8 = ((uVar8 & uVar11) >> 1 ^ uVar8) * (uVar6 >> 0x1b | 1) * 0x6935fa69;
      uVar8 = ((uVar8 & uVar11) >> 0xb ^ uVar8) * 0x74dcb303;
      uVar8 = ((uVar8 & uVar11) >> 2 ^ uVar8) * -0x61afe33d;
      uVar8 = ((uVar8 & uVar11) >> 2 ^ uVar8) * -0x379f5c21 & uVar11;
      uVar8 = uVar8 >> 5 ^ uVar8;
    } while (uVar9 <= uVar8);
    uVar8 = (uVar8 + uVar6) % uVar9;
  }
  if (uVar2 == 0) {
    TVar4 = (this->pixel).super_Tuple2<pbrt::Point2,_int>;
    iVar3 = this->pixelTileSize;
    this->dimension = 2;
    TVar1 = this->pixelSamples->ptr
            [(int)(((int)((long)((ulong)(uint)(TVar4.y >> 0x1f) << 0x20 | (ulong)TVar4 >> 0x20) %
                         (long)iVar3) * iVar3 +
                   (int)((long)((ulong)(uint)(TVar4.x >> 0x1f) << 0x20 | (ulong)TVar4 & 0xffffffff)
                        % (long)iVar3)) * this->samplesPerPixel + uVar8)].
            super_Tuple2<pbrt::Point2,_float>;
  }
  else {
    uVar9 = (this->pixel).super_Tuple2<pbrt::Point2,_int>.x;
    uVar6 = (this->pixel).super_Tuple2<pbrt::Point2,_int>.y;
    if (((int)(uVar6 | uVar9 | uVar2) < 0) || ((int)(uVar9 | uVar6 | uVar2 + 1) < 0)) {
      LogFatal<char_const(&)[40]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/bluenoise.h"
                 ,0x17,"Check failed: %s",(char (*) [40])"textureIndex >= 0 && px >= 0 && py >= 0");
    }
    uVar9 = (uVar9 & 0x7f) << 8;
    uVar7 = (ulong)((uVar6 & 0x7f) * 2);
    auVar13 = vpinsrw_avx(ZEXT216(*(ushort *)
                                   (BlueNoiseTextures +
                                   uVar7 + (ulong)(uVar2 % 0x30 << 0xf) + (ulong)uVar9)),
                          (uint)*(ushort *)
                                 (BlueNoiseTextures +
                                 uVar7 + (ulong)((uVar2 + 1) % 0x30 << 0xf) + (ulong)uVar9),2);
    auVar13 = vcvtdq2ps_avx(auVar13);
    auVar12._8_4_ = 0x477fff00;
    auVar12._0_8_ = 0x477fff00477fff00;
    auVar12._12_4_ = 0x477fff00;
    auVar12 = vdivps_avx512vl(auVar13,auVar12);
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         (&pmj02bnSamples)[(long)((int)uVar2 % 5) * 0x10000 + (long)((int)uVar8 % 0x10000)];
    auVar13 = vcvtudq2pd_avx512vl(auVar13);
    auVar5._12_4_ = 0x3df00000;
    auVar5._0_12_ = ZEXT812(0x3df0000000000000);
    auVar13 = vmulpd_avx512vl(auVar13,auVar5);
    auVar13 = vcvtpd2ps_avx(auVar13);
    auVar14._0_4_ = auVar12._0_4_ + auVar13._0_4_;
    auVar14._4_4_ = auVar12._4_4_ + auVar13._4_4_;
    auVar14._8_4_ = auVar12._8_4_ + auVar13._8_4_;
    auVar14._12_4_ = auVar12._12_4_ + auVar13._12_4_;
    if (1.0 <= auVar14._0_4_) {
      auVar14 = ZEXT416((uint)(auVar14._0_4_ + -1.0));
    }
    auVar13 = vmovshdup_avx(auVar14);
    if (1.0 <= auVar13._0_4_) {
      auVar14 = vinsertps_avx(auVar14,ZEXT416((uint)(auVar13._0_4_ + -1.0)),0x10);
    }
    this->dimension = uVar2 + 2;
    auVar15._8_4_ = 0x3f7fffff;
    auVar15._0_8_ = 0x3f7fffff3f7fffff;
    auVar15._12_4_ = 0x3f7fffff;
    auVar13 = vminps_avx(auVar15,auVar14);
    TVar1 = auVar13._0_8_;
  }
  return (Point2f)TVar1;
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        // Don't start permuting until the second time through: when we
        // permute, that breaks the progressive part of the pattern and in
        // turn, convergence is similar to random until the very end. This way,
        // we generally do well for intermediate images as well.
        int index = sampleIndex;
        int pmjInstance = dimension;
        if (pmjInstance >= nPMJ02bnSets) {
            uint64_t hash =
                MixBits(((uint64_t)pixel.x << 48) ^ ((uint64_t)pixel.y << 32) ^
                        ((uint64_t)dimension << 16) ^ GetOptions().seed);
            index = PermutationElement(sampleIndex, samplesPerPixel, hash);
        }

        if (dimension == 0) {
            // special case the pixel sample
            int offset = pixelSampleOffset(Point2i(pixel));
            dimension += 2;
            return (*pixelSamples)[offset + index];
        } else {
            Vector2f cpOffset(BlueNoise(dimension, pixel.x, pixel.y),
                              BlueNoise(dimension + 1, pixel.x, pixel.y));
            Point2f u = GetPMJ02BNSample(pmjInstance % nPMJ02bnSets, index) + cpOffset;
            if (u.x >= 1)
                u.x -= 1;
            if (u.y >= 1)
                u.y -= 1;
            dimension += 2;
            return {std::min(u.x, OneMinusEpsilon), std::min(u.y, OneMinusEpsilon)};
        }
    }